

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Driver.cpp
# Opt level: O3

bool __thiscall
slang::driver::Driver::processCommandFiles
          (Driver *this,string_view pattern,bool makeRelative,bool separateUnit)

{
  flat_hash_set<std::filesystem::path> *arrays_;
  size_t *psVar1;
  long lVar2;
  group_type_pointer pgVar3;
  group_type_pointer pgVar4;
  ulong uVar5;
  value_type_pointer ppVar6;
  uint uVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  size_t sVar10;
  string_type *psVar11;
  _Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false> _Var12;
  _List _Var13;
  path *ppVar14;
  byte bVar15;
  uchar uVar16;
  int iVar17;
  uint uVar18;
  ulong uVar19;
  bool bVar20;
  ulong uVar21;
  path *ppVar22;
  ulong uVar23;
  size_type *p;
  undefined7 in_register_00000081;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 aVar24;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 path;
  path *ppVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  uchar uVar28;
  uchar uVar29;
  byte bVar30;
  uchar uVar31;
  uchar uVar32;
  uchar uVar33;
  byte bVar34;
  uchar uVar35;
  uchar uVar36;
  uchar uVar37;
  byte bVar38;
  uchar uVar39;
  uchar uVar40;
  uchar uVar41;
  uchar uVar42;
  byte bVar43;
  error_code eVar44;
  string_view text;
  string_view argList;
  string_view pattern_00;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  format_args args;
  format_args args_00;
  format_args args_01;
  path currPath;
  error_code ec;
  SmallVector<char,_40UL> buffer;
  error_code globEc;
  SmallVector<std::filesystem::__cxx11::path,_2UL> files;
  error_code *in_stack_fffffffffffffe10;
  undefined1 local_1c8 [32];
  _Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false> local_1a8;
  ulong local_1a0;
  path *local_198;
  undefined4 local_18c;
  path local_188;
  error_code local_158;
  size_type local_148 [2];
  undefined1 local_138 [24];
  char acStack_120 [40];
  uchar local_f8;
  uchar uStack_f7;
  uchar uStack_f6;
  byte bStack_f5;
  uchar uStack_f4;
  uchar uStack_f3;
  uchar uStack_f2;
  byte bStack_f1;
  uchar uStack_f0;
  uchar uStack_ef;
  uchar uStack_ee;
  byte bStack_ed;
  uchar uStack_ec;
  uchar uStack_eb;
  uchar uStack_ea;
  byte bStack_e9;
  undefined8 local_e8;
  uchar uStack_e0;
  uchar uStack_df;
  uchar uStack_de;
  byte bStack_dd;
  uchar uStack_dc;
  uchar uStack_db;
  uchar uStack_da;
  byte bStack_d9;
  path *local_d8;
  error_category *local_d0;
  int local_c8 [2];
  error_category *local_c0;
  uchar local_b8;
  uchar uStack_b7;
  uchar uStack_b6;
  byte bStack_b5;
  uchar uStack_b4;
  uchar uStack_b3;
  uchar uStack_b2;
  byte bStack_b1;
  uchar uStack_b0;
  uchar uStack_af;
  uchar uStack_ae;
  byte bStack_ad;
  uchar uStack_ac;
  uchar uStack_ab;
  uchar uStack_aa;
  byte bStack_a9;
  uchar local_a8;
  uchar uStack_a7;
  uchar uStack_a6;
  byte bStack_a5;
  uchar uStack_a4;
  uchar uStack_a3;
  uchar uStack_a2;
  byte bStack_a1;
  uchar uStack_a0;
  uchar uStack_9f;
  uchar uStack_9e;
  byte bStack_9d;
  uchar uStack_9c;
  uchar uStack_9b;
  uchar uStack_9a;
  byte bStack_99;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 local_98;
  long local_90;
  undefined8 local_88;
  undefined1 local_80 [80];
  
  pattern_00._M_len = pattern._M_str;
  ppVar25 = (path *)pattern._M_len;
  local_18c = (undefined4)CONCAT71(in_register_00000081,separateUnit);
  local_98.values_ = (value<fmt::v11::context> *)local_80;
  local_90 = 0;
  local_88 = 2;
  local_c8[0] = 0;
  local_d0 = (error_category *)std::_V2::system_category();
  local_c0 = local_d0;
  std::filesystem::__cxx11::path::path((path *)local_138);
  aVar24.values_ = (value<fmt::v11::context> *)0x0;
  pattern_00._M_str = (char *)0x0;
  ppVar22 = ppVar25;
  svGlob((slang *)local_138,ppVar25,pattern_00,(GlobMode)&local_98,
         (SmallVector<std::filesystem::__cxx11::path,_2UL> *)0x0,SUB81(local_c8,0),
         in_stack_fffffffffffffe10);
  std::filesystem::__cxx11::path::~path((path *)local_138);
  if (local_c8[0] == 0) {
    bVar20 = true;
    if (local_90 != 0) {
      local_d8 = (path *)(local_90 * 0x28 + (long)local_98.values_);
      arrays_ = &this->activeCommandFiles;
      path = local_98;
      do {
        local_138._0_8_ = acStack_120;
        local_138._8_8_ = (path *)0x0;
        local_138._16_8_ = &DAT_00000028;
        eVar44 = OS::readFile((path *)path.values_,(SmallVector<char,_40UL> *)local_138);
        if (eVar44._M_value != 0) {
          (**(code **)(*(long *)eVar44._M_cat + 0x20))(&local_158,eVar44._M_cat,eVar44._M_value);
          local_1c8._0_8_ = ((path.values_)->field_0).long_long_value;
          local_1c8._8_8_ = ((path.values_)->field_0).string.size;
          local_1c8._16_8_ = CONCAT44(local_158._4_4_,local_158._M_value);
          local_1c8._24_8_ = local_158._M_cat;
          fmt_01.size_ = 0xdd;
          fmt_01.data_ = (char *)0x15;
          args_01.field_1.args_ = aVar24.args_;
          args_01.desc_ = (unsigned_long_long)local_1c8;
          ::fmt::v11::vformat_abi_cxx11_
                    (&local_188._M_pathname,(v11 *)"command file \'{}\': {}",fmt_01,args_01);
          ppVar22 = &local_188;
          printError(this,&ppVar22->_M_pathname);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_188._M_pathname._M_dataplus._M_p != &local_188._M_pathname.field_2) {
            ppVar22 = (path *)(local_188._M_pathname.field_2._M_allocated_capacity + 1);
            operator_delete(local_188._M_pathname._M_dataplus._M_p,(size_t)ppVar22);
          }
          p = (size_type *)CONCAT44(local_158._4_4_,local_158._M_value);
          if ((size_type *)CONCAT44(local_158._4_4_,local_158._M_value) != local_148) {
LAB_00633074:
            ppVar22 = (path *)(local_148[0] + 1);
            operator_delete(p,(size_t)ppVar22);
          }
LAB_0063307c:
          this->anyFailedLoads = true;
          if ((char *)local_138._0_8_ != acStack_120) {
LAB_00633095:
            operator_delete((void *)local_138._0_8_);
          }
          goto LAB_00632acd;
        }
        uVar19 = std::filesystem::__cxx11::hash_value((path *)path.values_);
        auVar8._8_8_ = 0;
        auVar8._0_8_ = uVar19;
        uVar21 = SUB168(auVar8 * ZEXT816(0x9e3779b97f4a7c15),8) ^
                 SUB168(auVar8 * ZEXT816(0x9e3779b97f4a7c15),0);
        ppVar25 = (path *)(uVar21 >>
                          ((byte)(arrays_->table_).
                                 super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::filesystem::__cxx11::path>,_slang::hash<std::filesystem::__cxx11::path>,_std::equal_to<std::filesystem::__cxx11::path>,_std::allocator<std::filesystem::__cxx11::path>_>
                                 .arrays.groups_size_index & 0x3f));
        lVar2 = (uVar21 & 0xff) * 4;
        uVar16 = (&UNK_0092f4ac)[lVar2];
        uVar28 = (&UNK_0092f4ad)[lVar2];
        uVar29 = (&UNK_0092f4ae)[lVar2];
        bVar30 = (&UNK_0092f4af)[lVar2];
        uVar19 = (ulong)((uint)uVar21 & 7);
        uVar23 = 0;
        ppVar22 = ppVar25;
        uVar31 = uVar16;
        uVar32 = uVar28;
        uVar33 = uVar29;
        bVar34 = bVar30;
        uVar35 = uVar16;
        uVar36 = uVar28;
        uVar37 = uVar29;
        bVar38 = bVar30;
        uVar39 = uVar16;
        uVar40 = uVar28;
        uVar41 = uVar29;
        bVar43 = bVar30;
        do {
          pgVar4 = (this->activeCommandFiles).table_.
                   super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::filesystem::__cxx11::path>,_slang::hash<std::filesystem::__cxx11::path>,_std::equal_to<std::filesystem::__cxx11::path>,_std::allocator<std::filesystem::__cxx11::path>_>
                   .arrays.groups_;
          pgVar3 = pgVar4 + (long)ppVar22;
          local_a8 = pgVar3->m[0].n;
          uStack_a7 = pgVar3->m[1].n;
          uStack_a6 = pgVar3->m[2].n;
          bStack_a5 = pgVar3->m[3].n;
          uStack_a4 = pgVar3->m[4].n;
          uStack_a3 = pgVar3->m[5].n;
          uStack_a2 = pgVar3->m[6].n;
          bStack_a1 = pgVar3->m[7].n;
          uStack_a0 = pgVar3->m[8].n;
          uStack_9f = pgVar3->m[9].n;
          uStack_9e = pgVar3->m[10].n;
          bStack_9d = pgVar3->m[0xb].n;
          uStack_9c = pgVar3->m[0xc].n;
          uStack_9b = pgVar3->m[0xd].n;
          uStack_9a = pgVar3->m[0xe].n;
          bVar15 = pgVar3->m[0xf].n;
          auVar26[0] = -(local_a8 == uVar16);
          auVar26[1] = -(uStack_a7 == uVar28);
          auVar26[2] = -(uStack_a6 == uVar29);
          auVar26[3] = -(bStack_a5 == bVar30);
          auVar26[4] = -(uStack_a4 == uVar31);
          auVar26[5] = -(uStack_a3 == uVar32);
          auVar26[6] = -(uStack_a2 == uVar33);
          auVar26[7] = -(bStack_a1 == bVar34);
          auVar26[8] = -(uStack_a0 == uVar35);
          auVar26[9] = -(uStack_9f == uVar36);
          auVar26[10] = -(uStack_9e == uVar37);
          auVar26[0xb] = -(bStack_9d == bVar38);
          auVar26[0xc] = -(uStack_9c == uVar39);
          auVar26[0xd] = -(uStack_9b == uVar40);
          auVar26[0xe] = -(uStack_9a == uVar41);
          auVar26[0xf] = -(bVar15 == bVar43);
          uVar18 = (uint)(ushort)((ushort)(SUB161(auVar26 >> 7,0) & 1) |
                                  (ushort)(SUB161(auVar26 >> 0xf,0) & 1) << 1 |
                                  (ushort)(SUB161(auVar26 >> 0x17,0) & 1) << 2 |
                                  (ushort)(SUB161(auVar26 >> 0x1f,0) & 1) << 3 |
                                  (ushort)(SUB161(auVar26 >> 0x27,0) & 1) << 4 |
                                  (ushort)(SUB161(auVar26 >> 0x2f,0) & 1) << 5 |
                                  (ushort)(SUB161(auVar26 >> 0x37,0) & 1) << 6 |
                                  (ushort)(SUB161(auVar26 >> 0x3f,0) & 1) << 7 |
                                  (ushort)(SUB161(auVar26 >> 0x47,0) & 1) << 8 |
                                  (ushort)(SUB161(auVar26 >> 0x4f,0) & 1) << 9 |
                                  (ushort)(SUB161(auVar26 >> 0x57,0) & 1) << 10 |
                                  (ushort)(SUB161(auVar26 >> 0x5f,0) & 1) << 0xb |
                                  (ushort)(SUB161(auVar26 >> 0x67,0) & 1) << 0xc |
                                  (ushort)(SUB161(auVar26 >> 0x6f,0) & 1) << 0xd |
                                 (ushort)(SUB161(auVar26 >> 0x77,0) & 1) << 0xe);
          ppVar14 = ppVar22;
          bStack_99 = bVar15;
          if (uVar18 != 0) {
            do {
              local_e8 = uVar23;
              bStack_e9 = bVar43;
              uStack_ea = uVar41;
              uStack_eb = uVar40;
              uStack_ec = uVar39;
              bStack_ed = bVar38;
              uStack_ee = uVar37;
              uStack_ef = uVar36;
              uStack_f0 = uVar35;
              bStack_f1 = bVar34;
              uStack_f2 = uVar33;
              uStack_f3 = uVar32;
              uStack_f4 = uVar31;
              bStack_f5 = bVar30;
              uStack_f6 = uVar29;
              uStack_f7 = uVar28;
              local_f8 = uVar16;
              local_198 = ppVar14;
              local_1a0 = uVar19;
              iVar17 = 0;
              if (uVar18 != 0) {
                for (; (uVar18 >> iVar17 & 1) == 0; iVar17 = iVar17 + 1) {
                }
              }
              iVar17 = std::filesystem::__cxx11::path::compare((path *)path.values_);
              if (iVar17 == 0) {
                local_188._M_pathname._M_dataplus._M_p =
                     (pointer)((path.values_)->field_0).long_long_value;
                local_188._M_pathname._M_string_length = ((path.values_)->field_0).string.size;
                fmt_00.size_ = 0xd;
                fmt_00.data_ = (char *)0x2d;
                args_00.field_1.args_ = aVar24.args_;
                args_00.desc_ = (unsigned_long_long)&local_188;
                ::fmt::v11::vformat_abi_cxx11_
                          ((string *)local_1c8,
                           (v11 *)"command file \'{}\' includes itself recursively",fmt_00,args_00);
                ppVar22 = (path *)local_1c8;
                printError(this,(string *)ppVar22);
                local_148[0] = local_1c8._16_8_;
                p = (size_type *)local_1c8._0_8_;
                if ((undefined1 *)local_1c8._0_8_ == local_1c8 + 0x10) goto LAB_0063307c;
                goto LAB_00633074;
              }
              uVar18 = uVar18 - 1 & uVar18;
              uVar19 = local_1a0;
              ppVar14 = local_198;
              uVar16 = local_f8;
              uVar28 = uStack_f7;
              uVar29 = uStack_f6;
              bVar30 = bStack_f5;
              uVar31 = uStack_f4;
              uVar32 = uStack_f3;
              uVar33 = uStack_f2;
              bVar34 = bStack_f1;
              uVar35 = uStack_f0;
              uVar36 = uStack_ef;
              uVar37 = uStack_ee;
              bVar38 = bStack_ed;
              uVar39 = uStack_ec;
              uVar40 = uStack_eb;
              uVar41 = uStack_ea;
              bVar43 = bStack_e9;
              uVar23 = local_e8;
            } while (uVar18 != 0);
            bVar15 = pgVar4[(long)ppVar22].m[0xf].n;
            ppVar22 = local_198;
          }
          if (((&boost::unordered::detail::foa::
                 group15<boost::unordered::detail::foa::plain_integral>::
                 is_not_overflowed(unsigned_long)::shift)[uVar19] & bVar15) == 0) break;
          uVar5 = (this->activeCommandFiles).table_.
                  super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::filesystem::__cxx11::path>,_slang::hash<std::filesystem::__cxx11::path>,_std::equal_to<std::filesystem::__cxx11::path>,_std::allocator<std::filesystem::__cxx11::path>_>
                  .arrays.groups_size_mask;
          lVar2 = uVar23 + 1;
          uVar23 = uVar23 + 1;
          ppVar22 = (path *)((ulong)((long)&(ppVar22->_M_pathname)._M_dataplus._M_p + lVar2) & uVar5
                            );
        } while (uVar23 <= uVar5);
        if ((this->activeCommandFiles).table_.
            super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::filesystem::__cxx11::path>,_slang::hash<std::filesystem::__cxx11::path>,_std::equal_to<std::filesystem::__cxx11::path>,_std::allocator<std::filesystem::__cxx11::path>_>
            .size_ctrl.size <
            (this->activeCommandFiles).table_.
            super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::filesystem::__cxx11::path>,_slang::hash<std::filesystem::__cxx11::path>,_std::equal_to<std::filesystem::__cxx11::path>,_std::allocator<std::filesystem::__cxx11::path>_>
            .size_ctrl.ml) {
          aVar24 = path;
          boost::unordered::detail::foa::
          table_core<boost::unordered::detail::foa::flat_set_types<std::filesystem::__cxx11::path>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::filesystem::__cxx11::path,void>,std::equal_to<std::filesystem::__cxx11::path>,std::allocator<std::filesystem::__cxx11::path>>
          ::nosize_unchecked_emplace_at<std::filesystem::__cxx11::path_const&>
                    ((locator *)local_1c8,
                     (table_core<boost::unordered::detail::foa::flat_set_types<std::filesystem::__cxx11::path>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::filesystem::__cxx11::path,void>,std::equal_to<std::filesystem::__cxx11::path>,std::allocator<std::filesystem::__cxx11::path>>
                      *)arrays_,(arrays_type *)arrays_,(size_t)ppVar25,uVar21,(path *)path.values_);
          psVar1 = &(this->activeCommandFiles).table_.
                    super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::filesystem::__cxx11::path>,_slang::hash<std::filesystem::__cxx11::path>,_std::equal_to<std::filesystem::__cxx11::path>,_std::allocator<std::filesystem::__cxx11::path>_>
                    .size_ctrl.size;
          *psVar1 = *psVar1 + 1;
        }
        else {
          boost::unordered::detail::foa::
          table_core<boost::unordered::detail::foa::flat_set_types<std::filesystem::__cxx11::path>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::filesystem::__cxx11::path,void>,std::equal_to<std::filesystem::__cxx11::path>,std::allocator<std::filesystem::__cxx11::path>>
          ::unchecked_emplace_with_rehash<std::filesystem::__cxx11::path_const&>
                    ((locator *)local_1c8,
                     (table_core<boost::unordered::detail::foa::flat_set_types<std::filesystem::__cxx11::path>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::filesystem::__cxx11::path,void>,std::equal_to<std::filesystem::__cxx11::path>,std::allocator<std::filesystem::__cxx11::path>>
                      *)arrays_,uVar21,(path *)path.values_);
        }
        std::filesystem::__cxx11::path::path((path *)local_1c8);
        local_158._M_value = 0;
        local_158._M_cat = local_d0;
        if (makeRelative) {
          std::filesystem::current_path_abi_cxx11_((error_code *)&local_188);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c8,
                     &local_188._M_pathname);
          _Var13._M_impl._M_t.
          super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
          ._M_t.
          super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
          .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl
               = local_188._M_cmpts._M_impl._M_t.
                 super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                 ._M_t.
                 super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                 .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>.
                 _M_head_impl;
          _Var12._M_head_impl = local_1a8._M_head_impl;
          local_188._M_cmpts._M_impl._M_t.
          super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
          ._M_t.
          super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
          .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl
               = (unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                  )(__uniq_ptr_data<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter,_true,_true>
                    )0x0;
          local_1a8._M_head_impl =
               (_Impl *)_Var13._M_impl._M_t.
                        super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                        .
                        super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>
                        ._M_head_impl;
          if (_Var12._M_head_impl != (_Impl *)0x0) {
            std::filesystem::__cxx11::path::_List::_Impl_deleter::operator()
                      ((_Impl_deleter *)&local_1a8,_Var12._M_head_impl);
          }
          std::filesystem::__cxx11::path::clear(&local_188);
          std::filesystem::__cxx11::path::~path(&local_188);
          std::filesystem::__cxx11::path::parent_path();
          std::filesystem::current_path(&local_188,&local_158);
          std::filesystem::__cxx11::path::~path(&local_188);
        }
        text._M_len = (path *)((long)&(((path *)(local_138._8_8_ + -0x28))->_M_cmpts)._M_impl._M_t.
                                      super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                                      .
                                      super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>
                              + 7);
        local_138._8_8_ = text._M_len;
        if ((char)local_18c == '\0') {
          argList._M_str = (char *)local_138._0_8_;
          argList._M_len = (size_t)text._M_len;
          uVar16 = parseCommandLine(this,argList,(ParseOptions)0x1010101);
        }
        else {
          text._M_str = (char *)local_138._0_8_;
          uVar16 = parseUnitListing(this,text);
        }
        if (makeRelative) {
          std::filesystem::current_path((path *)local_1c8,&local_158);
        }
        uVar19 = std::filesystem::__cxx11::hash_value((path *)path.values_);
        auVar9._8_8_ = 0;
        auVar9._0_8_ = uVar19;
        uVar23 = SUB168(auVar9 * ZEXT816(0x9e3779b97f4a7c15),8) ^
                 SUB168(auVar9 * ZEXT816(0x9e3779b97f4a7c15),0);
        uVar19 = uVar23 >> ((byte)(arrays_->table_).
                                  super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::filesystem::__cxx11::path>,_slang::hash<std::filesystem::__cxx11::path>,_std::equal_to<std::filesystem::__cxx11::path>,_std::allocator<std::filesystem::__cxx11::path>_>
                                  .arrays.groups_size_index & 0x3f);
        lVar2 = (uVar23 & 0xff) * 4;
        uVar28 = (&UNK_0092f4ac)[lVar2];
        uVar29 = (&UNK_0092f4ad)[lVar2];
        uVar31 = (&UNK_0092f4ae)[lVar2];
        bVar30 = (&UNK_0092f4af)[lVar2];
        ppVar22 = (path *)0x0;
        uVar32 = uVar28;
        uVar33 = uVar29;
        uVar35 = uVar31;
        bVar34 = bVar30;
        uVar36 = uVar28;
        uVar37 = uVar29;
        uVar39 = uVar31;
        bVar38 = bVar30;
        uVar40 = uVar28;
        uVar41 = uVar29;
        uVar42 = uVar31;
        bVar43 = bVar30;
        do {
          pgVar4 = (this->activeCommandFiles).table_.
                   super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::filesystem::__cxx11::path>,_slang::hash<std::filesystem::__cxx11::path>,_std::equal_to<std::filesystem::__cxx11::path>,_std::allocator<std::filesystem::__cxx11::path>_>
                   .arrays.groups_;
          pgVar3 = pgVar4 + uVar19;
          local_b8 = pgVar3->m[0].n;
          uStack_b7 = pgVar3->m[1].n;
          uStack_b6 = pgVar3->m[2].n;
          bStack_b5 = pgVar3->m[3].n;
          uStack_b4 = pgVar3->m[4].n;
          uStack_b3 = pgVar3->m[5].n;
          uStack_b2 = pgVar3->m[6].n;
          bStack_b1 = pgVar3->m[7].n;
          uStack_b0 = pgVar3->m[8].n;
          uStack_af = pgVar3->m[9].n;
          uStack_ae = pgVar3->m[10].n;
          bStack_ad = pgVar3->m[0xb].n;
          uStack_ac = pgVar3->m[0xc].n;
          uStack_ab = pgVar3->m[0xd].n;
          uStack_aa = pgVar3->m[0xe].n;
          bVar15 = pgVar3->m[0xf].n;
          auVar27[0] = -(local_b8 == uVar28);
          auVar27[1] = -(uStack_b7 == uVar29);
          auVar27[2] = -(uStack_b6 == uVar31);
          auVar27[3] = -(bStack_b5 == bVar30);
          auVar27[4] = -(uStack_b4 == uVar32);
          auVar27[5] = -(uStack_b3 == uVar33);
          auVar27[6] = -(uStack_b2 == uVar35);
          auVar27[7] = -(bStack_b1 == bVar34);
          auVar27[8] = -(uStack_b0 == uVar36);
          auVar27[9] = -(uStack_af == uVar37);
          auVar27[10] = -(uStack_ae == uVar39);
          auVar27[0xb] = -(bStack_ad == bVar38);
          auVar27[0xc] = -(uStack_ac == uVar40);
          auVar27[0xd] = -(uStack_ab == uVar41);
          auVar27[0xe] = -(uStack_aa == uVar42);
          auVar27[0xf] = -(bVar15 == bVar43);
          uVar18 = (uint)(ushort)((ushort)(SUB161(auVar27 >> 7,0) & 1) |
                                  (ushort)(SUB161(auVar27 >> 0xf,0) & 1) << 1 |
                                  (ushort)(SUB161(auVar27 >> 0x17,0) & 1) << 2 |
                                  (ushort)(SUB161(auVar27 >> 0x1f,0) & 1) << 3 |
                                  (ushort)(SUB161(auVar27 >> 0x27,0) & 1) << 4 |
                                  (ushort)(SUB161(auVar27 >> 0x2f,0) & 1) << 5 |
                                  (ushort)(SUB161(auVar27 >> 0x37,0) & 1) << 6 |
                                  (ushort)(SUB161(auVar27 >> 0x3f,0) & 1) << 7 |
                                  (ushort)(SUB161(auVar27 >> 0x47,0) & 1) << 8 |
                                  (ushort)(SUB161(auVar27 >> 0x4f,0) & 1) << 9 |
                                  (ushort)(SUB161(auVar27 >> 0x57,0) & 1) << 10 |
                                  (ushort)(SUB161(auVar27 >> 0x5f,0) & 1) << 0xb |
                                  (ushort)(SUB161(auVar27 >> 0x67,0) & 1) << 0xc |
                                  (ushort)(SUB161(auVar27 >> 0x6f,0) & 1) << 0xd |
                                 (ushort)(SUB161(auVar27 >> 0x77,0) & 1) << 0xe);
          bStack_a9 = bVar15;
          if (uVar18 != 0) {
            local_e8 = CONCAT17(bVar34,CONCAT16(uVar35,CONCAT15(uVar33,CONCAT14(uVar32,CONCAT13(
                                                  bVar30,CONCAT12(uVar31,CONCAT11(uVar29,uVar28)))))
                                               ));
            ppVar6 = (this->activeCommandFiles).table_.
                     super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::filesystem::__cxx11::path>,_slang::hash<std::filesystem::__cxx11::path>,_std::equal_to<std::filesystem::__cxx11::path>,_std::allocator<std::filesystem::__cxx11::path>_>
                     .arrays.elements_;
            local_1a0 = uVar19;
            local_198 = ppVar22;
            local_f8 = uVar16;
            uStack_e0 = uVar36;
            uStack_df = uVar37;
            uStack_de = uVar39;
            bStack_dd = bVar38;
            uStack_dc = uVar40;
            uStack_db = uVar41;
            uStack_da = uVar42;
            bStack_d9 = bVar43;
            do {
              uVar7 = 0;
              if (uVar18 != 0) {
                for (; (uVar18 >> uVar7 & 1) == 0; uVar7 = uVar7 + 1) {
                }
              }
              uVar21 = (ulong)uVar7;
              ppVar25 = ppVar6 + uVar19 * 0xf + uVar21;
              ppVar22 = ppVar25;
              iVar17 = std::filesystem::__cxx11::path::compare((path *)path.values_);
              if (iVar17 == 0) {
                std::filesystem::__cxx11::path::~path(ppVar25);
                bVar30 = (&boost::unordered::detail::foa::
                           group15<boost::unordered::detail::foa::plain_integral>::
                           is_not_overflowed(unsigned_long)::shift)[pgVar4[uVar19].m[uVar21].n & 7];
                bVar34 = *(byte *)((ulong)(pgVar4[uVar19].m + uVar21) | 0xf);
                pgVar4[uVar19].m[uVar21].n = '\0';
                sVar10 = (this->activeCommandFiles).table_.
                         super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::filesystem::__cxx11::path>,_slang::hash<std::filesystem::__cxx11::path>,_std::equal_to<std::filesystem::__cxx11::path>,_std::allocator<std::filesystem::__cxx11::path>_>
                         .size_ctrl.size;
                (this->activeCommandFiles).table_.
                super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::filesystem::__cxx11::path>,_slang::hash<std::filesystem::__cxx11::path>,_std::equal_to<std::filesystem::__cxx11::path>,_std::allocator<std::filesystem::__cxx11::path>_>
                .size_ctrl.ml =
                     (this->activeCommandFiles).table_.
                     super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::filesystem::__cxx11::path>,_slang::hash<std::filesystem::__cxx11::path>,_std::equal_to<std::filesystem::__cxx11::path>,_std::allocator<std::filesystem::__cxx11::path>_>
                     .size_ctrl.ml - (ulong)((bVar30 & bVar34) != 0);
                (this->activeCommandFiles).table_.
                super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::filesystem::__cxx11::path>,_slang::hash<std::filesystem::__cxx11::path>,_std::equal_to<std::filesystem::__cxx11::path>,_std::allocator<std::filesystem::__cxx11::path>_>
                .size_ctrl.size = sVar10 - 1;
                uVar16 = local_f8;
                goto LAB_00632f25;
              }
              uVar18 = uVar18 - 1 & uVar18;
            } while (uVar18 != 0);
            bVar15 = pgVar4[uVar19].m[0xf].n;
            ppVar22 = local_198;
            uVar19 = local_1a0;
            uVar28 = (uchar)local_e8;
            uVar29 = local_e8._1_1_;
            uVar31 = local_e8._2_1_;
            bVar30 = local_e8._3_1_;
            uVar32 = local_e8._4_1_;
            uVar33 = local_e8._5_1_;
            uVar35 = local_e8._6_1_;
            bVar34 = local_e8._7_1_;
            uVar36 = uStack_e0;
            uVar37 = uStack_df;
            uVar39 = uStack_de;
            bVar38 = bStack_dd;
            uVar40 = uStack_dc;
            uVar41 = uStack_db;
            uVar42 = uStack_da;
            bVar43 = bStack_d9;
            uVar16 = local_f8;
          }
          if (((&boost::unordered::detail::foa::
                 group15<boost::unordered::detail::foa::plain_integral>::
                 is_not_overflowed(unsigned_long)::shift)[(uint)uVar23 & 7] & bVar15) == 0) break;
          ppVar25 = (path *)(this->activeCommandFiles).table_.
                            super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::filesystem::__cxx11::path>,_slang::hash<std::filesystem::__cxx11::path>,_std::equal_to<std::filesystem::__cxx11::path>,_std::allocator<std::filesystem::__cxx11::path>_>
                            .arrays.groups_size_mask;
          psVar11 = &ppVar22->_M_pathname;
          ppVar22 = (path *)((long)&(ppVar22->_M_pathname)._M_dataplus._M_p + 1);
          uVar19 = (long)&(psVar11->_M_dataplus)._M_p + uVar19 + 1 & (ulong)ppVar25;
        } while (ppVar22 <= ppVar25);
LAB_00632f25:
        if (uVar16 == '\0') {
          this->anyFailedLoads = true;
          std::filesystem::__cxx11::path::~path((path *)local_1c8);
          if ((char *)local_138._0_8_ != acStack_120) goto LAB_00633095;
          goto LAB_00632acd;
        }
        std::filesystem::__cxx11::path::~path((path *)local_1c8);
        if ((char *)local_138._0_8_ != acStack_120) {
          operator_delete((void *)local_138._0_8_);
        }
        path.values_ = (value<fmt::v11::context> *)((_List *)(path.values_ + 2) + 1);
        ppVar22 = (path *)local_138;
      } while ((path *)path.values_ != local_d8);
      bVar20 = true;
    }
  }
  else {
    (**(code **)(*(long *)local_c0 + 0x20))(&local_188);
    local_138._16_8_ = local_188._M_pathname._M_dataplus._M_p;
    acStack_120[0] = (undefined1)local_188._M_pathname._M_string_length;
    acStack_120[1] = local_188._M_pathname._M_string_length._1_1_;
    acStack_120[2] = local_188._M_pathname._M_string_length._2_1_;
    acStack_120[3] = local_188._M_pathname._M_string_length._3_1_;
    acStack_120[4] = local_188._M_pathname._M_string_length._4_1_;
    acStack_120[5] = local_188._M_pathname._M_string_length._5_1_;
    acStack_120[6] = local_188._M_pathname._M_string_length._6_1_;
    acStack_120[7] = local_188._M_pathname._M_string_length._7_1_;
    fmt.size_ = 0xdd;
    fmt.data_ = (char *)0x15;
    args.field_1.values_ = aVar24.values_;
    args.desc_ = (unsigned_long_long)local_138;
    local_138._0_8_ = pattern_00._M_len;
    local_138._8_8_ = ppVar25;
    ::fmt::v11::vformat_abi_cxx11_((string *)local_1c8,(v11 *)"command file \'{}\': {}",fmt,args);
    ppVar22 = (path *)local_1c8;
    printError(this,(string *)ppVar22);
    if ((undefined1 *)local_1c8._0_8_ != local_1c8 + 0x10) {
      ppVar22 = (path *)(local_1c8._16_8_ + 1);
      operator_delete((void *)local_1c8._0_8_,(size_t)ppVar22);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_188._M_pathname._M_dataplus._M_p != &local_188._M_pathname.field_2) {
      ppVar22 = (path *)(local_188._M_pathname.field_2._M_allocated_capacity + 1);
      operator_delete(local_188._M_pathname._M_dataplus._M_p,(size_t)ppVar22);
    }
    this->anyFailedLoads = true;
LAB_00632acd:
    bVar20 = false;
  }
  SmallVectorBase<std::filesystem::__cxx11::path>::cleanup
            ((SmallVectorBase<std::filesystem::__cxx11::path> *)&local_98,(EVP_PKEY_CTX *)ppVar22);
  return bVar20;
}

Assistant:

bool Driver::processCommandFiles(std::string_view pattern, bool makeRelative, bool separateUnit) {
    auto onError = [this](const auto& name, std::error_code ec) {
        printError(fmt::format("command file '{}': {}", name, ec.message()));
        anyFailedLoads = true;
        return false;
    };

    SmallVector<fs::path> files;
    std::error_code globEc;
    svGlob({}, pattern, GlobMode::Files, files, /* expandEnvVars */ false, globEc);
    if (globEc)
        return onError(pattern, globEc);

    for (auto& path : files) {
        SmallVector<char> buffer;
        if (auto readEc = OS::readFile(path, buffer))
            return onError(getU8Str(path), readEc);

        if (!activeCommandFiles.insert(path).second) {
            printError(
                fmt::format("command file '{}' includes itself recursively", getU8Str(path)));
            anyFailedLoads = true;
            return false;
        }

        fs::path currPath;
        std::error_code ec;
        if (makeRelative) {
            currPath = fs::current_path(ec);
            fs::current_path(path.parent_path(), ec);
        }

        SLANG_ASSERT(!buffer.empty());
        buffer.pop_back();
        std::string_view argStr(buffer.data(), buffer.size());

        bool result;
        if (separateUnit) {
            result = parseUnitListing(argStr);
        }
        else {
            CommandLine::ParseOptions parseOpts;
            parseOpts.expandEnvVars = true;
            parseOpts.ignoreProgramName = true;
            parseOpts.supportComments = true;
            parseOpts.ignoreDuplicates = true;
            result = parseCommandLine(argStr, parseOpts);
        }

        if (makeRelative)
            fs::current_path(currPath, ec);

        activeCommandFiles.erase(path);

        if (!result) {
            anyFailedLoads = true;
            return false;
        }
    }

    return true;
}